

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall
QCalendarWidgetPrivate::createNavigationBar(QCalendarWidgetPrivate *this,QWidget *widget)

{
  FormatType FVar1;
  QWidget *this_00;
  QCalendarModel *pQVar2;
  bool bVar3;
  int iVar4;
  int month;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QToolButton *pQVar5;
  QWidget *pQVar6;
  QMenu *this_02;
  QAction *pQVar7;
  QAction **ppQVar8;
  QSpinBox *pQVar9;
  QSpacerItem *pQVar10;
  QLayout *this_03;
  long in_FS_OFFSET;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  int i;
  QString local_78;
  FormatType local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_01.m_data = operator_new(0x28);
  QWidget::QWidget((QWidget *)this_01.m_data,widget,(WindowFlags)0x0);
  this->navBarBackground = (QWidget *)this_01;
  QVar11.m_size = (size_t)"qt_calendar_navigationbar";
  QVar11.field_0.m_data = this_01.m_data;
  QObject::setObjectName(QVar11);
  QWidget::setAutoFillBackground(this->navBarBackground,true);
  QWidget::setBackgroundRole(this->navBarBackground,Highlight);
  pQVar5 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(pQVar5,this->navBarBackground);
  *(undefined ***)&(pQVar5->super_QAbstractButton).super_QWidget = &PTR_metaObject_007fd1b0;
  *(undefined ***)&(pQVar5->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &PTR__QPrevNextCalButton_007fd380;
  this->prevMonth = pQVar5;
  pQVar5 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(pQVar5,this->navBarBackground);
  *(undefined ***)&(pQVar5->super_QAbstractButton).super_QWidget = &PTR_metaObject_007fd1b0;
  *(undefined ***)&(pQVar5->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &PTR__QPrevNextCalButton_007fd380;
  this->nextMonth = pQVar5;
  QToolButton::setAutoRaise(this->prevMonth,true);
  QToolButton::setAutoRaise(this->nextMonth,true);
  QWidget::setSizePolicy((QWidget *)this->prevMonth,(QSizePolicy)0x100000);
  QWidget::setSizePolicy((QWidget *)this->nextMonth,(QSizePolicy)0x100000);
  QToolButton::setAutoRaise(this->nextMonth,true);
  updateButtonIcons(this);
  QAbstractButton::setAutoRepeat(&this->prevMonth->super_QAbstractButton,true);
  QAbstractButton::setAutoRepeat(&this->nextMonth->super_QAbstractButton,true);
  pQVar6 = (QWidget *)operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)pQVar6,this->navBarBackground);
  *(undefined ***)pQVar6 = &PTR_metaObject_007fd528;
  *(undefined ***)&pQVar6->super_QPaintDevice = &PTR__QCalToolButton_007fd6f8;
  this->monthButton = (QCalToolButton *)pQVar6;
  QWidget::setSizePolicy(pQVar6,(QSizePolicy)0x100000);
  QToolButton::setAutoRaise(&this->monthButton->super_QToolButton,true);
  QToolButton::setPopupMode(&this->monthButton->super_QToolButton,InstantPopup);
  this_02 = (QMenu *)operator_new(0x28);
  QMenu::QMenu(this_02,(QWidget *)this->monthButton);
  this->monthMenu = this_02;
  local_5c = ShortFormat;
  iVar4 = QCalendar::maximumMonthsInYear();
  if ((int)local_5c <= iVar4) {
    do {
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = this->m_model;
      QWidget::locale((QLocale *)&local_58.shared,this_00);
      QCalendar::standaloneMonthName
                ((QLocale *)&local_78,(int)pQVar2 + 0x18,(int)&local_58,local_5c);
      QLocale::~QLocale((QLocale *)&local_58.shared);
      pQVar7 = QWidget::addAction(&this->monthMenu->super_QWidget,&local_78);
      ::QVariant::QVariant((QVariant *)&local_58,local_5c);
      QAction::setData((QVariant *)pQVar7);
      ::QVariant::~QVariant((QVariant *)&local_58);
      ppQVar8 = QMap<int,_QAction_*>::operator[](&this->monthToAction,(int *)&local_5c);
      *ppQVar8 = pQVar7;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      FVar1 = local_5c + ShortFormat;
      bVar3 = (int)local_5c < iVar4;
      local_5c = FVar1;
    } while (bVar3);
  }
  QToolButton::setMenu(&this->monthButton->super_QToolButton,this->monthMenu);
  pQVar6 = (QWidget *)operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)pQVar6,this->navBarBackground);
  *(undefined ***)pQVar6 = &PTR_metaObject_007fd528;
  *(undefined ***)&pQVar6->super_QPaintDevice = &PTR__QCalToolButton_007fd6f8;
  this->yearButton = (QCalToolButton *)pQVar6;
  QWidget::setSizePolicy(pQVar6,(QSizePolicy)0x100000);
  QToolButton::setAutoRaise(&this->yearButton->super_QToolButton,true);
  pQVar9 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar9,this->navBarBackground);
  this->yearEdit = pQVar9;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)local_58.data,&this_00->data->fnt);
  QFont::setWeight((Weight)&local_58);
  QWidget::setFont((QWidget *)this->monthButton,(QFont *)local_58.data);
  QWidget::setFont((QWidget *)this->yearButton,(QFont *)local_58.data);
  QAbstractSpinBox::setFrame((QAbstractSpinBox *)this->yearEdit,false);
  pQVar9 = this->yearEdit;
  iVar4 = QDate::year(&this->m_model->m_minimumDate,*(undefined8 *)&this->m_model->m_calendar);
  QSpinBox::setMinimum(pQVar9,iVar4);
  pQVar9 = this->yearEdit;
  iVar4 = QDate::year(&this->m_model->m_maximumDate,*(undefined8 *)&this->m_model->m_calendar);
  QSpinBox::setMaximum(pQVar9,iVar4);
  QWidget::hide((QWidget *)this->yearEdit);
  pQVar10 = (QSpacerItem *)operator_new(0x28);
  (pQVar10->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QSpacerItem_007f4e48;
  *(undefined8 *)&(pQVar10->super_QLayoutItem).align = 0;
  pQVar10->height = 0;
  pQVar10->sizeP = (anon_union_4_2_313b0b05_for_QSizePolicy_1)0x110000;
  (pQVar10->rect).x1 = 0;
  (pQVar10->rect).y1 = 0;
  (pQVar10->rect).x2 = -1;
  (pQVar10->rect).y2 = -1;
  this->spaceHolder = pQVar10;
  this_03 = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_03);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  QLayout::setContentsMargins(this_03,(QMargins *)&local_78);
  (**(code **)(*(long *)this_03 + 0x68))(this_03,0);
  QBoxLayout::addWidget((QBoxLayout *)this_03,(QWidget *)this->prevMonth,0,(Alignment)0x0);
  iVar4 = (**(code **)(*(long *)this_03 + 200))(this_03);
  QBoxLayout::insertStretch((QBoxLayout *)this_03,iVar4,0);
  QBoxLayout::addWidget((QBoxLayout *)this_03,(QWidget *)this->monthButton,0,(Alignment)0x0);
  (**(code **)(*(long *)this_03 + 0x80))(this_03,this->spaceHolder);
  QBoxLayout::addWidget((QBoxLayout *)this_03,(QWidget *)this->yearButton,0,(Alignment)0x0);
  iVar4 = (**(code **)(*(long *)this_03 + 200))(this_03);
  QBoxLayout::insertStretch((QBoxLayout *)this_03,iVar4,0);
  QBoxLayout::addWidget((QBoxLayout *)this_03,(QWidget *)this->nextMonth,0,(Alignment)0x0);
  QWidget::setLayout(this->navBarBackground,this_03);
  QWidget::setFocusPolicy((QWidget *)this->yearEdit,StrongFocus);
  QWidget::setFocusPolicy((QWidget *)this->prevMonth,NoFocus);
  QWidget::setFocusPolicy((QWidget *)this->nextMonth,NoFocus);
  QWidget::setFocusPolicy((QWidget *)this->yearButton,NoFocus);
  QWidget::setFocusPolicy((QWidget *)this->monthButton,NoFocus);
  QVar12.m_size = (size_t)"qt_calendar_prevmonth";
  QVar12.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->prevMonth;
  QObject::setObjectName(QVar12);
  QVar13.m_size = (size_t)"qt_calendar_nextmonth";
  QVar13.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->nextMonth;
  QObject::setObjectName(QVar13);
  QVar14.m_size = (size_t)"qt_calendar_monthbutton";
  QVar14.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->monthButton;
  QObject::setObjectName(QVar14);
  QVar15.m_size = (size_t)"qt_calendar_yearbutton";
  QVar15.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->yearButton;
  QObject::setObjectName(QVar15);
  QVar16.m_size = (size_t)"qt_calendar_yearedit";
  QVar16.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->yearEdit;
  QObject::setObjectName(QVar16);
  updateMonthMenu(this);
  iVar4 = QDate::year(&this->m_model->m_date,*(undefined8 *)&this->m_model->m_calendar);
  month = QDate::month(&this->m_model->m_date,*(undefined8 *)&this->m_model->m_calendar);
  showMonth(this,iVar4,month);
  QFont::~QFont((QFont *)local_58.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::createNavigationBar(QWidget *widget)
{
    Q_Q(QCalendarWidget);
    navBarBackground = new QWidget(widget);
    navBarBackground->setObjectName("qt_calendar_navigationbar"_L1);
    navBarBackground->setAutoFillBackground(true);
    navBarBackground->setBackgroundRole(QPalette::Highlight);

    prevMonth = new QPrevNextCalButton(navBarBackground);
    nextMonth = new QPrevNextCalButton(navBarBackground);
    prevMonth->setAutoRaise(true);
    nextMonth->setAutoRaise(true);
    prevMonth->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    nextMonth->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    nextMonth->setAutoRaise(true);
    updateButtonIcons();
    prevMonth->setAutoRepeat(true);
    nextMonth->setAutoRepeat(true);

    monthButton = new QCalToolButton(navBarBackground);
    monthButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    monthButton->setAutoRaise(true);
    monthButton->setPopupMode(QToolButton::InstantPopup);
    monthMenu = new QMenu(monthButton);
    for (int i = 1, e = m_model->m_calendar.maximumMonthsInYear(); i <= e; i++) {
        QString monthName(m_model->monthName(q->locale(), i));
        QAction *act = monthMenu->addAction(monthName);
        act->setData(i);
        monthToAction[i] = act;
    }
    monthButton->setMenu(monthMenu);
    yearButton = new QCalToolButton(navBarBackground);
    yearButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    yearButton->setAutoRaise(true);
    yearEdit = new QSpinBox(navBarBackground);

    QFont font = q->font();
    font.setBold(true);
    monthButton->setFont(font);
    yearButton->setFont(font);
    yearEdit->setFrame(false);
    yearEdit->setMinimum(m_model->m_minimumDate.year(m_model->m_calendar));
    yearEdit->setMaximum(m_model->m_maximumDate.year(m_model->m_calendar));
    yearEdit->hide();
    spaceHolder = new QSpacerItem(0,0);

    QHBoxLayout *headerLayout = new QHBoxLayout;
    headerLayout->setContentsMargins(QMargins());
    headerLayout->setSpacing(0);
    headerLayout->addWidget(prevMonth);
    headerLayout->insertStretch(headerLayout->count());
    headerLayout->addWidget(monthButton);
    headerLayout->addItem(spaceHolder);
    headerLayout->addWidget(yearButton);
    headerLayout->insertStretch(headerLayout->count());
    headerLayout->addWidget(nextMonth);
    navBarBackground->setLayout(headerLayout);

    yearEdit->setFocusPolicy(Qt::StrongFocus);
    prevMonth->setFocusPolicy(Qt::NoFocus);
    nextMonth->setFocusPolicy(Qt::NoFocus);
    yearButton->setFocusPolicy(Qt::NoFocus);
    monthButton->setFocusPolicy(Qt::NoFocus);

    //set names for the header controls.
    prevMonth->setObjectName("qt_calendar_prevmonth"_L1);
    nextMonth->setObjectName("qt_calendar_nextmonth"_L1);
    monthButton->setObjectName("qt_calendar_monthbutton"_L1);
    yearButton->setObjectName("qt_calendar_yearbutton"_L1);
    yearEdit->setObjectName("qt_calendar_yearedit"_L1);

    updateMonthMenu();
    showMonth(m_model->m_date.year(m_model->m_calendar), m_model->m_date.month(m_model->m_calendar));
}